

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O2

void free_file_expr(gvisitor_t *self,gnode_file_expr_t *node)

{
  uint32_t uVar1;
  cstring_r *pcVar2;
  char *__ptr;
  size_t sVar3;
  size_t _i;
  ulong uVar4;
  
  uVar1 = (node->base).refcount;
  if (uVar1 != 0) {
    (node->base).refcount = uVar1 - 1;
    return;
  }
  if (node->identifiers == (cstring_r *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = node->identifiers->n;
  }
  for (uVar4 = 0; pcVar2 = node->identifiers, sVar3 != uVar4; uVar4 = uVar4 + 1) {
    if (uVar4 < pcVar2->n) {
      __ptr = pcVar2->p[uVar4];
    }
    else {
      __ptr = (char *)0x0;
    }
    free(__ptr);
  }
  if (pcVar2 != (cstring_r *)0x0) {
    free(pcVar2->p);
    free(node->identifiers);
  }
  free(node);
  return;
}

Assistant:

static void free_file_expr (gvisitor_t *self, gnode_file_expr_t *node) {
    #pragma unused(self)
    CHECK_REFCOUNT(node);
    cstring_array_each(node->identifiers, {
        mem_free((void *)val);
    });

    if (node->identifiers) gnode_array_free(node->identifiers);
    mem_free((void *)node);
}